

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void __thiscall argo::unparser::unparse_array(unparser *this,json *j,int indent_level)

{
  char *pcVar1;
  bool bVar2;
  type tVar3;
  writer *pwVar4;
  json_array *pjVar5;
  size_type sVar6;
  pointer pjVar7;
  type j_00;
  int iVar8;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  reference local_a0;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *i;
  const_iterator __end1;
  const_iterator __begin1;
  json_array *__range1;
  int n;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  json *pjStack_18;
  int indent_level_local;
  json *j_local;
  unparser *this_local;
  
  local_1c = indent_level;
  pjStack_18 = j;
  j_local = (json *)this;
  print_indent(this,indent_level);
  pwVar4 = operator<<(this->m_writer,'[');
  pcVar1 = this->m_space;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,&local_41);
  pwVar4 = operator<<(pwVar4,(string *)local_40);
  pcVar1 = this->m_newline;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&n,pcVar1,(allocator *)((long)&__range1 + 7));
  operator<<(pwVar4,(string *)&n);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pjVar5 = json::get_array(pjStack_18);
  sVar6 = std::
          vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
          ::size(pjVar5);
  __range1._0_4_ = (int)sVar6;
  pjVar5 = json::get_array(pjStack_18);
  __end1 = std::
           vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           ::begin(pjVar5);
  i = (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)
      std::
      vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ::end(pjVar5);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_*,_std::vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
                                *)&i);
    if (!bVar2) break;
    local_a0 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_*,_std::vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
               ::operator*(&__end1);
    pjVar7 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->(local_a0);
    tVar3 = json::get_instance_type(pjVar7);
    if (tVar3 != object_e) {
      pjVar7 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->(local_a0);
      tVar3 = json::get_instance_type(pjVar7);
      if (tVar3 != array_e) {
        print_indent(this,local_1c + this->m_indent_inc);
      }
    }
    j_00 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*(local_a0);
    unparse(this,j_00,local_1c + this->m_indent_inc);
    iVar8 = (int)__range1 + -1;
    bVar2 = 1 < (int)__range1;
    __range1._0_4_ = iVar8;
    if (bVar2) {
      pwVar4 = operator<<(this->m_writer,',');
      pcVar1 = this->m_space;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
      operator<<(pwVar4,(string *)local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    pwVar4 = this->m_writer;
    pcVar1 = this->m_newline;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
    operator<<(pwVar4,(string *)local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_*,_std::vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
    ::operator++(&__end1);
  }
  print_indent(this,local_1c);
  pwVar4 = this->m_writer;
  pcVar1 = this->m_space;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,pcVar1,&local_111);
  pwVar4 = operator<<(pwVar4,(string *)local_110);
  operator<<(pwVar4,']');
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  return;
}

Assistant:

void unparser::unparse_array(const json &j, int indent_level)
{
    print_indent(indent_level);
    m_writer << '[' << m_space << m_newline;
    int n = j.get_array().size();
    for (const auto &i : j.get_array())
    {
        if (i->get_instance_type() != json::object_e &&
            i->get_instance_type() != json::array_e)
        {
            print_indent(indent_level + m_indent_inc);
        }
        unparse(*i, indent_level + m_indent_inc);
        if (n-- > 1)
        {
            m_writer << ',' << m_space;
        }
        m_writer << m_newline;
    }
    print_indent(indent_level);
    m_writer << m_space << ']';
}